

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O3

wchar_t get_use_device_chance(object *obj)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t wVar4;
  int iVar5;
  
  wVar2 = (player->state).skills[2];
  if (obj->artifact == (artifact *)0x0) {
    pwVar3 = &obj->kind->level;
  }
  else {
    pwVar3 = &obj->artifact->level;
  }
  wVar4 = L'\n';
  if (L'\n' < wVar2) {
    wVar4 = wVar2;
  }
  if (L'\x95' < wVar4) {
    wVar4 = L'\x96';
  }
  iVar1 = (wVar4 - *pwVar3) * 2 + 1;
  iVar5 = -iVar1;
  if (-1 < wVar4 - *pwVar3) {
    iVar5 = iVar1;
  }
  return (iVar1 * -0x172) / (iVar5 + 5) + L'ż';
}

Assistant:

int get_use_device_chance(const struct object *obj)
{
	int lev, fail, x;
	int skill = MIN(MAX(player->state.skills[SKILL_DEVICE], 10), 150);

	/* Extract the item level, which is the difficulty rating */
	if (obj->artifact)
		lev = obj->artifact->level;
	else
		lev = obj->kind->level;

	/* Calculate x */
	x = 2 * (skill - lev) + 1;

	/* Now calculate the failure rate */
	fail = -370 * x;
	fail /= (5 + ABS(x));
	fail += 380;

	return fail;
}